

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryBooleanOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  Op OVar1;
  uint **ppuVar2;
  uint32_t i_1;
  uint id;
  int iVar3;
  uint32_t uVar4;
  ConstantManager *this_00;
  Operand *pOVar5;
  uint **ppuVar6;
  Constant *pCVar7;
  undefined4 extraout_var;
  uint32_t i;
  long lVar9;
  BoolConstant *constants [2];
  BoolConstant *pBVar8;
  
  OVar1 = inst->opcode_;
  this_00 = IRContext::get_constant_mgr(this->context_);
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    pOVar5 = Instruction::GetInOperand(inst,(uint32_t)lVar9);
    if (pOVar5->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ppuVar2 = (uint **)(pOVar5->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar6 = &(pOVar5->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar6 = ppuVar2;
    }
    id = std::function<unsigned_int_(unsigned_int)>::operator()(id_map,**ppuVar6);
    pCVar7 = analysis::ConstantManager::FindDeclaredConstant(this_00,id);
    if (pCVar7 == (Constant *)0x0) {
      pBVar8 = (BoolConstant *)0x0;
    }
    else {
      iVar3 = (*pCVar7->_vptr_Constant[0x10])(pCVar7);
      pBVar8 = (BoolConstant *)CONCAT44(extraout_var,iVar3);
    }
    constants[lVar9] = pBVar8;
  }
  if (OVar1 == OpLogicalOr) {
    uVar4 = 1;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      if ((constants[lVar9] != (BoolConstant *)0x0) && (constants[lVar9]->value_ != false))
      goto LAB_004ba05a;
    }
  }
  else if (OVar1 == OpLogicalAnd) {
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      if ((constants[lVar9] != (BoolConstant *)0x0) && (constants[lVar9]->value_ != true)) {
        uVar4 = 0;
LAB_004ba05a:
        *result = uVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool InstructionFolder::FoldBinaryBooleanOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::BoolConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsBoolConstant() : nullptr);
  }

  switch (opcode) {
    // Logical
    case spv::Op::OpLogicalOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->value()) {
            *result = true;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpLogicalAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (!constants[i]->value()) {
            *result = false;
            return true;
          }
        }
      }
      break;

    default:
      break;
  }
  return false;
}